

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseTemplateParam(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    bVar7 = ParseTwoCharToken(state,"T_");
    if (bVar7) {
LAB_004ca67e:
      MaybeAppend(state,"?");
      bVar7 = true;
      goto LAB_004ca74e;
    }
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar7 = ParseOneCharToken(state,'T');
    if (bVar7) {
      bVar7 = ParseNumber(state,(int *)0x0);
      if (bVar7) {
        bVar7 = ParseOneCharToken(state,'_');
        if (bVar7) goto LAB_004ca67e;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"TL");
    if (bVar7) {
      bVar7 = ParseNumber(state,(int *)0x0);
      if (bVar7) {
        bVar7 = ParseTwoCharToken(state,"__");
        if (bVar7) goto LAB_004ca67e;
        bVar7 = ParseOneCharToken(state,'_');
        if (bVar7) {
          bVar7 = ParseNumber(state,(int *)0x0);
          if (bVar7) {
            bVar7 = ParseOneCharToken(state,'_');
            if (bVar7) goto LAB_004ca67e;
          }
        }
      }
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  }
  bVar7 = false;
LAB_004ca74e:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar7;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T_
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;              // ::= T <parameter-2 non-negative number> _
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "TL") && ParseNumber(state, nullptr)) {
    if (ParseTwoCharToken(state, "__")) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;              // ::= TL <level-1> __
    }

    if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
        ParseOneCharToken(state, '_')) {
      MaybeAppend(state, "?");  // We don't support template substitutions.
      return true;  // ::= TL <level-1> _ <parameter-2 non-negative number> _
    }
  }
  state->parse_state = copy;
  return false;
}